

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O1

void __thiscall
slang::ast::builtins::StringSubstrMethod::StringSubstrMethod
          (StringSubstrMethod *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_41;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_40;
  Type *local_28;
  PredefinedIntegerType *local_20;
  
  local_28 = (Type *)&builtins->intType;
  __l._M_len = 2;
  __l._M_array = &local_28;
  local_20 = (PredefinedIntegerType *)local_28;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_40,__l,&local_41);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,Substr,Function,2,&local_40,
             &(builtins->stringType).super_Type,true,false);
  if (local_40.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_00ccfcc0;
  return;
}

Assistant:

explicit StringSubstrMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Substr, SubroutineKind::Function, 2,
                               {&builtins.intType, &builtins.intType}, builtins.stringType, true) {}